

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O0

void ConvertRGB24ToY_SSE2(uint8_t *rgb,uint8_t *y,int width)

{
  int iVar1;
  uint in_EDX;
  long in_RSI;
  byte *in_RDI;
  __m128i Y1;
  __m128i Y0;
  __m128i b;
  __m128i g;
  __m128i r;
  __m128i zero;
  int j;
  __m128i rgb_plane [6];
  int i;
  int max_width;
  undefined8 local_1f8;
  undefined8 uStackY_1f0;
  undefined8 local_1e8;
  undefined8 uStackY_1e0;
  __m128i *in_stack_fffffffffffffe58;
  uint8_t *in_stack_fffffffffffffe60;
  int local_18c;
  undefined8 local_188;
  __m128i *in_stack_fffffffffffffe80;
  __m128i *in_stack_fffffffffffffe88;
  __m128i *in_stack_fffffffffffffe90;
  __m128i *in_stack_fffffffffffffe98;
  undefined8 auStack_160 [7];
  int local_124;
  uint local_120;
  uint local_11c;
  long local_118;
  byte *local_110;
  short local_108;
  short sStack_106;
  short sStack_104;
  short sStack_102;
  short sStack_100;
  short sStack_fe;
  short sStack_fc;
  short sStack_fa;
  short local_f8;
  short sStack_f6;
  short sStack_f4;
  short sStack_f2;
  short sStack_f0;
  short sStack_ee;
  short sStack_ec;
  short sStack_ea;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  __m128i *local_78;
  uint8_t *puStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  __m128i *local_58;
  uint8_t *puStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  __m128i *local_38;
  uint8_t *puStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  char local_18;
  char cStack_17;
  char cStack_16;
  char cStack_15;
  char cStack_14;
  char cStack_13;
  char cStack_12;
  char cStack_11;
  char cStack_10;
  char cStack_f;
  char cStack_e;
  char cStack_d;
  char cStack_c;
  char cStack_b;
  char cStack_a;
  char cStack_9;
  undefined8 *local_8;
  
  local_120 = in_EDX & 0xffffffe0;
  local_124 = 0;
  local_11c = in_EDX;
  local_118 = in_RSI;
  local_110 = in_RDI;
  while (local_124 < (int)local_120) {
    RGB24PackedToPlanar_SSE2(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58);
    for (local_18c = 0; local_18c < 2; local_18c = local_18c + 1) {
      local_e8 = 0;
      uStack_e0 = 0;
      in_stack_fffffffffffffe58 = (__m128i *)0x0;
      in_stack_fffffffffffffe60 = (uint8_t *)0x0;
      local_88 = (&local_188)[(long)local_18c * 2];
      uStack_80 = auStack_160[(long)local_18c * 2 + -4];
      local_98 = 0;
      uStack_90 = 0;
      local_a8 = auStack_160[(long)local_18c * 2 + -1];
      uStack_a0 = auStack_160[(long)local_18c * 2];
      local_b8 = 0;
      uStack_b0 = 0;
      local_c8 = auStack_160[(long)local_18c * 2 + 3];
      uStack_c0 = auStack_160[(long)local_18c * 2 + 4];
      local_d8 = 0;
      uStack_d0 = 0;
      ConvertRGBToY_SSE2(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                         in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      local_28 = (&local_188)[(long)local_18c * 2];
      uStack_20 = auStack_160[(long)local_18c * 2 + -4];
      local_48 = auStack_160[(long)local_18c * 2 + -1];
      uStack_40 = auStack_160[(long)local_18c * 2];
      local_68 = auStack_160[(long)local_18c * 2 + 3];
      uStack_60 = auStack_160[(long)local_18c * 2 + 4];
      local_78 = in_stack_fffffffffffffe58;
      puStack_70 = in_stack_fffffffffffffe60;
      local_58 = in_stack_fffffffffffffe58;
      puStack_50 = in_stack_fffffffffffffe60;
      local_38 = in_stack_fffffffffffffe58;
      puStack_30 = in_stack_fffffffffffffe60;
      ConvertRGBToY_SSE2(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                         in_stack_fffffffffffffe88,in_stack_fffffffffffffe80);
      local_8 = (undefined8 *)(local_118 + local_124);
      local_f8 = (short)local_1e8;
      sStack_f6 = (short)((ulong)local_1e8 >> 0x10);
      sStack_f4 = (short)((ulong)local_1e8 >> 0x20);
      sStack_f2 = (short)((ulong)local_1e8 >> 0x30);
      sStack_f0 = (short)uStackY_1e0;
      sStack_ee = (short)((ulong)uStackY_1e0 >> 0x10);
      sStack_ec = (short)((ulong)uStackY_1e0 >> 0x20);
      sStack_ea = (short)((ulong)uStackY_1e0 >> 0x30);
      local_108 = (short)local_1f8;
      sStack_106 = (short)((ulong)local_1f8 >> 0x10);
      sStack_104 = (short)((ulong)local_1f8 >> 0x20);
      sStack_102 = (short)((ulong)local_1f8 >> 0x30);
      sStack_100 = (short)uStackY_1f0;
      sStack_fe = (short)((ulong)uStackY_1f0 >> 0x10);
      sStack_fc = (short)((ulong)uStackY_1f0 >> 0x20);
      sStack_fa = (short)((ulong)uStackY_1f0 >> 0x30);
      local_18 = (0 < local_f8) * (local_f8 < 0x100) * (char)local_1e8 - (0xff < local_f8);
      cStack_17 = (0 < sStack_f6) * (sStack_f6 < 0x100) * (char)((ulong)local_1e8 >> 0x10) -
                  (0xff < sStack_f6);
      cStack_16 = (0 < sStack_f4) * (sStack_f4 < 0x100) * (char)((ulong)local_1e8 >> 0x20) -
                  (0xff < sStack_f4);
      cStack_15 = (0 < sStack_f2) * (sStack_f2 < 0x100) * (char)((ulong)local_1e8 >> 0x30) -
                  (0xff < sStack_f2);
      cStack_14 = (0 < sStack_f0) * (sStack_f0 < 0x100) * (char)uStackY_1e0 - (0xff < sStack_f0);
      cStack_13 = (0 < sStack_ee) * (sStack_ee < 0x100) * (char)((ulong)uStackY_1e0 >> 0x10) -
                  (0xff < sStack_ee);
      cStack_12 = (0 < sStack_ec) * (sStack_ec < 0x100) * (char)((ulong)uStackY_1e0 >> 0x20) -
                  (0xff < sStack_ec);
      cStack_11 = (0 < sStack_ea) * (sStack_ea < 0x100) * (char)((ulong)uStackY_1e0 >> 0x30) -
                  (0xff < sStack_ea);
      cStack_10 = (0 < local_108) * (local_108 < 0x100) * (char)local_1f8 - (0xff < local_108);
      cStack_f = (0 < sStack_106) * (sStack_106 < 0x100) * (char)((ulong)local_1f8 >> 0x10) -
                 (0xff < sStack_106);
      cStack_e = (0 < sStack_104) * (sStack_104 < 0x100) * (char)((ulong)local_1f8 >> 0x20) -
                 (0xff < sStack_104);
      cStack_d = (0 < sStack_102) * (sStack_102 < 0x100) * (char)((ulong)local_1f8 >> 0x30) -
                 (0xff < sStack_102);
      cStack_c = (0 < sStack_100) * (sStack_100 < 0x100) * (char)uStackY_1f0 - (0xff < sStack_100);
      cStack_b = (0 < sStack_fe) * (sStack_fe < 0x100) * (char)((ulong)uStackY_1f0 >> 0x10) -
                 (0xff < sStack_fe);
      cStack_a = (0 < sStack_fc) * (sStack_fc < 0x100) * (char)((ulong)uStackY_1f0 >> 0x20) -
                 (0xff < sStack_fc);
      cStack_9 = (0 < sStack_fa) * (sStack_fa < 0x100) * (char)((ulong)uStackY_1f0 >> 0x30) -
                 (0xff < sStack_fa);
      *local_8 = CONCAT17(cStack_11,
                          CONCAT16(cStack_12,
                                   CONCAT15(cStack_13,
                                            CONCAT14(cStack_14,
                                                     CONCAT13(cStack_15,
                                                              CONCAT12(cStack_16,
                                                                       CONCAT11(cStack_17,local_18))
                                                             )))));
      local_8[1] = CONCAT17(cStack_9,CONCAT16(cStack_a,CONCAT15(cStack_b,CONCAT14(cStack_c,CONCAT13(
                                                  cStack_d,CONCAT12(cStack_e,CONCAT11(cStack_f,
                                                  cStack_10)))))));
      local_124 = local_124 + 0x10;
    }
    local_110 = local_110 + 0x60;
  }
  for (; local_124 < (int)local_11c; local_124 = local_124 + 1) {
    iVar1 = VP8RGBToY((uint)*local_110,(uint)local_110[1],(uint)local_110[2],0x8000);
    *(char *)(local_118 + local_124) = (char)iVar1;
    local_110 = local_110 + 3;
  }
  return;
}

Assistant:

static void ConvertRGB24ToY_SSE2(const uint8_t* rgb, uint8_t* y, int width) {
  const int max_width = width & ~31;
  int i;
  for (i = 0; i < max_width; rgb += 3 * 16 * 2) {
    __m128i rgb_plane[6];
    int j;

    RGB24PackedToPlanar_SSE2(rgb, rgb_plane);

    for (j = 0; j < 2; ++j, i += 16) {
      const __m128i zero = _mm_setzero_si128();
      __m128i r, g, b, Y0, Y1;

      // Convert to 16-bit Y.
      r = _mm_unpacklo_epi8(rgb_plane[0 + j], zero);
      g = _mm_unpacklo_epi8(rgb_plane[2 + j], zero);
      b = _mm_unpacklo_epi8(rgb_plane[4 + j], zero);
      ConvertRGBToY_SSE2(&r, &g, &b, &Y0);

      // Convert to 16-bit Y.
      r = _mm_unpackhi_epi8(rgb_plane[0 + j], zero);
      g = _mm_unpackhi_epi8(rgb_plane[2 + j], zero);
      b = _mm_unpackhi_epi8(rgb_plane[4 + j], zero);
      ConvertRGBToY_SSE2(&r, &g, &b, &Y1);

      // Cast to 8-bit and store.
      STORE_16(_mm_packus_epi16(Y0, Y1), y + i);
    }
  }
  for (; i < width; ++i, rgb += 3) {   // left-over
    y[i] = VP8RGBToY(rgb[0], rgb[1], rgb[2], YUV_HALF);
  }
}